

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdIf.cpp
# Opt level: O2

Object * __thiscall CmdIf::execute(CmdIf *this,Engine *engine)

{
  bool bVar1;
  uint uVar2;
  runtime_error *this_00;
  ICommand **ppIVar3;
  
  bVar1 = executeBool(this->condition,engine);
  if (bVar1) {
    ppIVar3 = &this->command;
LAB_00105b87:
    executeVoid(*ppIVar3,engine);
    return (Object *)0x0;
  }
  if (this->elseStatementsCount == 0) {
    return (Object *)0x0;
  }
  uVar2 = (*(*this->elseStatements)->_vptr_ICommand[1])();
  if ((char)uVar2 == '\x05') {
    bVar1 = executeBool(*this->elseStatements,engine);
    if (bVar1) {
      return (Object *)0x0;
    }
  }
  else if ((uVar2 & 0xff) == 4) {
    ppIVar3 = this->elseStatements;
    goto LAB_00105b87;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"CmdIf::execute => unknown else statement type!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object *CmdIf::execute(Engine *engine) {
	if (executeBool(this->condition, engine)) {
		executeVoid(this->command, engine);
	} else {
		unsigned int i;
		for (i = 0; i < this->elseStatementsCount; i++) {
			CommandType type = this->elseStatements[i]->getType();
			switch (type) {
				case CT_ELSE:
					executeVoid(this->elseStatements[i], engine);
					return nullptr;
				case CT_ELSE_IF:
					if (executeBool(this->elseStatements[i], engine)) {
						return nullptr;
					}
				default:
					throw std::runtime_error("CmdIf::execute => unknown else statement type!");
			}
		}
	}
	return nullptr;
}